

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O0

uint rlLoadTexture(void *data,int width,int height,int format,int mipmapCount)

{
  GLint local_78 [2];
  GLint swizzleMask_1 [4];
  GLint swizzleMask [4];
  GLenum local_50;
  uint glType;
  uint glFormat;
  uint glInternalFormat;
  uint mipSize;
  int i;
  int mipOffset;
  int mipHeight;
  int mipWidth;
  uint id;
  int mipmapCount_local;
  int format_local;
  int height_local;
  int width_local;
  void *data_local;
  
  mipWidth = mipmapCount;
  id = format;
  mipmapCount_local = height;
  format_local = width;
  _height_local = data;
  (*glad_glBindTexture)(0xde1,0);
  mipHeight = 0;
  if (((RLGL.ExtSupported.texCompDXT & 1U) == 0) &&
     ((((id == 0xb || (id == 0xc)) || (id == 0xd)) || (id == 0xe)))) {
    TraceLog(4,"GL: DXT compressed texture format not supported");
    data_local._4_4_ = mipHeight;
  }
  else if (((RLGL.ExtSupported.texCompETC1 & 1U) == 0) && (id == 0xf)) {
    TraceLog(4,"GL: ETC1 compressed texture format not supported");
    data_local._4_4_ = mipHeight;
  }
  else if (((RLGL.ExtSupported.texCompETC2 & 1U) == 0) && ((id == 0x10 || (id == 0x11)))) {
    TraceLog(4,"GL: ETC2 compressed texture format not supported");
    data_local._4_4_ = mipHeight;
  }
  else if (((RLGL.ExtSupported.texCompPVRT & 1U) == 0) && ((id == 0x12 || (id == 0x13)))) {
    TraceLog(4,"GL: PVRT compressed texture format not supported");
    data_local._4_4_ = mipHeight;
  }
  else if (((RLGL.ExtSupported.texCompASTC & 1U) == 0) && ((id == 0x14 || (id == 0x15)))) {
    TraceLog(4,"GL: ASTC compressed texture format not supported");
    data_local._4_4_ = mipHeight;
  }
  else {
    (*glad_glPixelStorei)(0xcf5,1);
    (*glad_glGenTextures)(1,(GLuint *)&mipHeight);
    (*glad_glBindTexture)(0xde1,mipHeight);
    mipOffset = format_local;
    i = mipmapCount_local;
    mipSize = 0;
    for (glInternalFormat = 0; (int)glInternalFormat < mipWidth;
        glInternalFormat = glInternalFormat + 1) {
      glFormat = rlGetPixelDataSize(mipOffset,i,id);
      rlGetGlTextureFormats(id,&glType,&local_50,(uint *)(swizzleMask + 3));
      if (glType != 0xffffffff) {
        if ((int)id < 0xb) {
          (*glad_glTexImage2D)
                    (0xde1,glInternalFormat,glType,mipOffset,i,0,local_50,swizzleMask[3],
                     (void *)((long)_height_local + (long)(int)mipSize));
        }
        else {
          (*glad_glCompressedTexImage2D)
                    (0xde1,glInternalFormat,glType,mipOffset,i,0,glFormat,
                     (void *)((long)_height_local + (long)(int)mipSize));
        }
        if (id == 1) {
          swizzleMask_1[2] = 0x1903;
          swizzleMask_1[3] = 0x1903;
          swizzleMask[0] = 0x1903;
          swizzleMask[1] = 1;
          (*glad_glTexParameteriv)(0xde1,0x8e46,swizzleMask_1 + 2);
        }
        else if (id == 2) {
          local_78[0] = 0x1903;
          local_78[1] = 0x1903;
          swizzleMask_1[0] = 0x1903;
          swizzleMask_1[1] = 0x1904;
          (*glad_glTexParameteriv)(0xde1,0x8e46,local_78);
        }
      }
      mipOffset = mipOffset / 2;
      i = i / 2;
      mipSize = glFormat + mipSize;
      if (mipOffset < 1) {
        mipOffset = 1;
      }
      if (i < 1) {
        i = 1;
      }
    }
    (*glad_glTexParameteri)(0xde1,0x2802,0x2901);
    (*glad_glTexParameteri)(0xde1,0x2803,0x2901);
    (*glad_glTexParameteri)(0xde1,0x2800,0x2600);
    (*glad_glTexParameteri)(0xde1,0x2801,0x2600);
    if (1 < mipWidth) {
      (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
      (*glad_glTexParameteri)(0xde1,0x2801,0x2703);
    }
    (*glad_glBindTexture)(0xde1,0);
    if (mipHeight == 0) {
      TraceLog(4,"TEXTURE: Failed to load texture");
    }
    else {
      TraceLog(3,"TEXTURE: [ID %i] Texture loaded successfully (%ix%i - %i mipmaps)",
               (ulong)(uint)mipHeight,(ulong)(uint)format_local,(ulong)(uint)mipmapCount_local,
               (ulong)(uint)mipWidth);
    }
    data_local._4_4_ = mipHeight;
  }
  return data_local._4_4_;
}

Assistant:

unsigned int rlLoadTexture(void *data, int width, int height, int format, int mipmapCount)
{
    glBindTexture(GL_TEXTURE_2D, 0);    // Free any old binding

    unsigned int id = 0;

    // Check texture format support by OpenGL 1.1 (compressed textures not supported)
#if defined(GRAPHICS_API_OPENGL_11)
    if (format >= PIXELFORMAT_COMPRESSED_DXT1_RGB)
    {
        TRACELOG(LOG_WARNING, "GL: OpenGL 1.1 does not support GPU compressed texture formats");
        return id;
    }
#else
    if ((!RLGL.ExtSupported.texCompDXT) && ((format == PIXELFORMAT_COMPRESSED_DXT1_RGB) || (format == PIXELFORMAT_COMPRESSED_DXT1_RGBA) ||
        (format == PIXELFORMAT_COMPRESSED_DXT3_RGBA) || (format == PIXELFORMAT_COMPRESSED_DXT5_RGBA)))
    {
        TRACELOG(LOG_WARNING, "GL: DXT compressed texture format not supported");
        return id;
    }
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    if ((!RLGL.ExtSupported.texCompETC1) && (format == PIXELFORMAT_COMPRESSED_ETC1_RGB))
    {
        TRACELOG(LOG_WARNING, "GL: ETC1 compressed texture format not supported");
        return id;
    }

    if ((!RLGL.ExtSupported.texCompETC2) && ((format == PIXELFORMAT_COMPRESSED_ETC2_RGB) || (format == PIXELFORMAT_COMPRESSED_ETC2_EAC_RGBA)))
    {
        TRACELOG(LOG_WARNING, "GL: ETC2 compressed texture format not supported");
        return id;
    }

    if ((!RLGL.ExtSupported.texCompPVRT) && ((format == PIXELFORMAT_COMPRESSED_PVRT_RGB) || (format == PIXELFORMAT_COMPRESSED_PVRT_RGBA)))
    {
        TRACELOG(LOG_WARNING, "GL: PVRT compressed texture format not supported");
        return id;
    }

    if ((!RLGL.ExtSupported.texCompASTC) && ((format == PIXELFORMAT_COMPRESSED_ASTC_4x4_RGBA) || (format == PIXELFORMAT_COMPRESSED_ASTC_8x8_RGBA)))
    {
        TRACELOG(LOG_WARNING, "GL: ASTC compressed texture format not supported");
        return id;
    }
#endif
#endif  // GRAPHICS_API_OPENGL_11

    glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

    glGenTextures(1, &id);              // Generate texture id

    glBindTexture(GL_TEXTURE_2D, id);

    int mipWidth = width;
    int mipHeight = height;
    int mipOffset = 0;          // Mipmap data offset

    // Load the different mipmap levels
    for (int i = 0; i < mipmapCount; i++)
    {
        unsigned int mipSize = rlGetPixelDataSize(mipWidth, mipHeight, format);

        unsigned int glInternalFormat, glFormat, glType;
        rlGetGlTextureFormats(format, &glInternalFormat, &glFormat, &glType);

        TRACELOGD("TEXTURE: Load mipmap level %i (%i x %i), size: %i, offset: %i", i, mipWidth, mipHeight, mipSize, mipOffset);

        if (glInternalFormat != -1)
        {
            if (format < PIXELFORMAT_COMPRESSED_DXT1_RGB) glTexImage2D(GL_TEXTURE_2D, i, glInternalFormat, mipWidth, mipHeight, 0, glFormat, glType, (unsigned char *)data + mipOffset);
#if !defined(GRAPHICS_API_OPENGL_11)
            else glCompressedTexImage2D(GL_TEXTURE_2D, i, glInternalFormat, mipWidth, mipHeight, 0, mipSize, (unsigned char *)data + mipOffset);
#endif

#if defined(GRAPHICS_API_OPENGL_33)
            if (format == PIXELFORMAT_UNCOMPRESSED_GRAYSCALE)
            {
                GLint swizzleMask[] = { GL_RED, GL_RED, GL_RED, GL_ONE };
                glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_RGBA, swizzleMask);
            }
            else if (format == PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA)
            {
#if defined(GRAPHICS_API_OPENGL_21)
                GLint swizzleMask[] = { GL_RED, GL_RED, GL_RED, GL_ALPHA };
#elif defined(GRAPHICS_API_OPENGL_33)
                GLint swizzleMask[] = { GL_RED, GL_RED, GL_RED, GL_GREEN };
#endif
                glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_RGBA, swizzleMask);
            }
#endif
        }

        mipWidth /= 2;
        mipHeight /= 2;
        mipOffset += mipSize;

        // Security check for NPOT textures
        if (mipWidth < 1) mipWidth = 1;
        if (mipHeight < 1) mipHeight = 1;
    }

    // Texture parameters configuration
    // NOTE: glTexParameteri does NOT affect texture uploading, just the way it's used
#if defined(GRAPHICS_API_OPENGL_ES2)
    // NOTE: OpenGL ES 2.0 with no GL_OES_texture_npot support (i.e. WebGL) has limited NPOT support, so CLAMP_TO_EDGE must be used
    if (RLGL.ExtSupported.texNPOT)
    {
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);       // Set texture to repeat on x-axis
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);       // Set texture to repeat on y-axis
    }
    else
    {
        // NOTE: If using negative texture coordinates (LoadOBJ()), it does not work!
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);       // Set texture to clamp on x-axis
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);       // Set texture to clamp on y-axis
    }
#else
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);       // Set texture to repeat on x-axis
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);       // Set texture to repeat on y-axis
#endif

    // Magnification and minification filters
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);  // Alternative: GL_LINEAR
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);  // Alternative: GL_LINEAR

#if defined(GRAPHICS_API_OPENGL_33)
    if (mipmapCount > 1)
    {
        // Activate Trilinear filtering if mipmaps are available
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_LINEAR);
    }
#endif

    // At this point we have the texture loaded in GPU and texture parameters configured

    // NOTE: If mipmaps were not in data, they are not generated automatically

    // Unbind current texture
    glBindTexture(GL_TEXTURE_2D, 0);

    if (id > 0) TRACELOG(LOG_INFO, "TEXTURE: [ID %i] Texture loaded successfully (%ix%i - %i mipmaps)", id, width, height, mipmapCount);
    else TRACELOG(LOG_WARNING, "TEXTURE: Failed to load texture");

    return id;
}